

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_info.cpp
# Opt level: O2

void __thiscall libtorrent::peer_info::peer_info(peer_info *this)

{
  (this->client)._M_dataplus._M_p = (pointer)&(this->client).field_2;
  (this->client)._M_string_length = 0;
  (this->client).field_2._M_local_buf[0] = '\0';
  (this->pieces).super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  (this->flags).m_val = 0;
  (this->source).m_val = '\0';
  digest32<160L>::clear(&this->pid);
  *(undefined8 *)((long)&(this->ip).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x10) = 0;
  *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x18) = 0x200000000;
  *(undefined8 *)&(this->ip).impl_.data_ = 2;
  (this->local_endpoint).impl_.data_.v6.sin6_scope_id = 0;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x10) = 0;
  (this->local_endpoint).impl_.data_.v6.sin6_flowinfo = 0;
  this->read_state = '\0';
  this->write_state = '\0';
  return;
}

Assistant:

peer_info::peer_info() = default;